

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O0

bool __thiscall
google::
dense_hashtable<std::pair<const_unsigned_long,_int>,_unsigned_long,_std::hash<unsigned_long>,_google::dense_hash_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>::SelectKey,_google::dense_hash_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>::SetKey,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>
::maybe_shrink(dense_hashtable<std::pair<const_unsigned_long,_int>,_unsigned_long,_std::hash<unsigned_long>,_google::dense_hash_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>::SelectKey,_google::dense_hash_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>::SetKey,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>
               *this)

{
  bool bVar1;
  ulong uVar2;
  size_type sVar3;
  size_type sVar4;
  dense_hashtable<std::pair<const_unsigned_long,_int>,_unsigned_long,_std::hash<unsigned_long>,_google::dense_hash_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>::SelectKey,_google::dense_hash_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>::SetKey,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>
  *in_RDI;
  float fVar5;
  dense_hashtable<std::pair<const_unsigned_long,_int>,_unsigned_long,_std::hash<unsigned_long>,_google::dense_hash_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>::SelectKey,_google::dense_hash_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>::SetKey,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>
  tmp;
  size_type sz;
  float shrink_factor;
  size_type shrink_threshold;
  size_type num_remain;
  bool retval;
  dense_hashtable<std::pair<const_unsigned_long,_int>,_unsigned_long,_std::hash<unsigned_long>,_google::dense_hash_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>::SelectKey,_google::dense_hash_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>::SetKey,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>
  *this_00;
  float in_stack_ffffffffffffff48;
  float in_stack_ffffffffffffff4c;
  float in_stack_ffffffffffffff50;
  float in_stack_ffffffffffffff54;
  float local_a8;
  size_type in_stack_ffffffffffffff70;
  dense_hashtable<std::pair<const_unsigned_long,_int>,_unsigned_long,_std::hash<unsigned_long>,_google::dense_hash_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>::SelectKey,_google::dense_hash_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>::SetKey,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>
  *in_stack_ffffffffffffff78;
  dense_hashtable<std::pair<const_unsigned_long,_int>,_unsigned_long,_std::hash<unsigned_long>,_google::dense_hash_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>::SelectKey,_google::dense_hash_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>::SetKey,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>
  *in_stack_ffffffffffffff80;
  ulong local_30;
  bool local_9;
  
  local_9 = false;
  uVar2 = in_RDI->num_elements - in_RDI->num_deleted;
  sVar3 = sparsehash_internal::
          sh_hashtable_settings<unsigned_long,_std::hash<unsigned_long>,_unsigned_long,_4>::
          shrink_threshold((sh_hashtable_settings<unsigned_long,_std::hash<unsigned_long>,_unsigned_long,_4>
                            *)in_RDI);
  if (((sVar3 != 0) && (uVar2 < sVar3)) && (sVar4 = bucket_count(in_RDI), 0x20 < sVar4)) {
    fVar5 = sparsehash_internal::
            sh_hashtable_settings<unsigned_long,_std::hash<unsigned_long>,_unsigned_long,_4>::
            shrink_factor((sh_hashtable_settings<unsigned_long,_std::hash<unsigned_long>,_unsigned_long,_4>
                           *)in_RDI);
    local_30 = bucket_count(in_RDI);
    local_a8 = in_stack_ffffffffffffff48;
    do {
      local_30 = local_30 >> 1;
      bVar1 = false;
      if (0x20 < local_30) {
        in_stack_ffffffffffffff54 = (float)(long)uVar2;
        local_a8 = (float)uVar2;
        in_stack_ffffffffffffff4c = (float)local_30;
        bVar1 = local_a8 < in_stack_ffffffffffffff4c * fVar5;
        in_stack_ffffffffffffff50 = in_stack_ffffffffffffff4c;
      }
    } while (bVar1);
    this_00 = (dense_hashtable<std::pair<const_unsigned_long,_int>,_unsigned_long,_std::hash<unsigned_long>,_google::dense_hash_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>::SelectKey,_google::dense_hash_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>::SetKey,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>
               *)&stack0xffffffffffffff78;
    dense_hashtable(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
    swap((dense_hashtable<std::pair<const_unsigned_long,_int>,_unsigned_long,_std::hash<unsigned_long>,_google::dense_hash_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>::SelectKey,_google::dense_hash_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>::SetKey,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>
          *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
         (dense_hashtable<std::pair<const_unsigned_long,_int>,_unsigned_long,_std::hash<unsigned_long>,_google::dense_hash_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>::SelectKey,_google::dense_hash_map<unsigned_long,_int,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>::SetKey,_std::equal_to<unsigned_long>,_google::libc_allocator_with_realloc<std::pair<const_unsigned_long,_int>_>_>
          *)CONCAT44(in_stack_ffffffffffffff4c,local_a8));
    local_9 = true;
    ~dense_hashtable(this_00);
  }
  sparsehash_internal::
  sh_hashtable_settings<unsigned_long,_std::hash<unsigned_long>,_unsigned_long,_4>::
  set_consider_shrink((sh_hashtable_settings<unsigned_long,_std::hash<unsigned_long>,_unsigned_long,_4>
                       *)in_RDI,false);
  return local_9;
}

Assistant:

bool maybe_shrink() {
    assert(num_elements >= num_deleted);
    assert((bucket_count() & (bucket_count() - 1)) == 0);  // is a power of two
    assert(bucket_count() >= HT_MIN_BUCKETS);
    bool retval = false;

    // If you construct a hashtable with < HT_DEFAULT_STARTING_BUCKETS,
    // we'll never shrink until you get relatively big, and we'll never
    // shrink below HT_DEFAULT_STARTING_BUCKETS.  Otherwise, something
    // like "dense_hash_set<int> x; x.insert(4); x.erase(4);" will
    // shrink us down to HT_MIN_BUCKETS buckets, which is too small.
    const size_type num_remain = num_elements - num_deleted;
    const size_type shrink_threshold = settings.shrink_threshold();
    if (shrink_threshold > 0 && num_remain < shrink_threshold &&
        bucket_count() > HT_DEFAULT_STARTING_BUCKETS) {
      const float shrink_factor = settings.shrink_factor();
      size_type sz = bucket_count() / 2;  // find how much we should shrink
      while (sz > HT_DEFAULT_STARTING_BUCKETS &&
             num_remain < sz * shrink_factor) {
        sz /= 2;  // stay a power of 2
      }
      dense_hashtable tmp(std::move(*this), sz);  // Do the actual resizing
      swap(tmp);                       // now we are tmp
      retval = true;
    }
    settings.set_consider_shrink(false);  // because we just considered it
    return retval;
  }